

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

string * nonius::detail::pretty_duration_abi_cxx11_(fp_seconds secs)

{
  _Setprecision _Var1;
  streamsize sVar2;
  ostream *poVar3;
  string *in_RDI;
  rep rVar4;
  ostringstream ss;
  string units;
  double magnitude;
  fp_seconds in_stack_fffffffffffffe08;
  double in_stack_fffffffffffffe48;
  string local_40 [40];
  double local_18;
  duration<double,_std::ratio<1L,_1L>_> local_10 [2];
  
  local_18 = get_magnitude(in_stack_fffffffffffffe08);
  units_for_magnitude_abi_cxx11_(in_stack_fffffffffffffe48);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffe48);
  sVar2 = std::ios_base::precision
                    ((ios_base *)
                     (&stack0xfffffffffffffe48 + *(long *)((long)in_stack_fffffffffffffe48 + -0x18))
                    );
  _Var1 = std::setprecision((int)sVar2);
  std::operator<<((ostream *)&stack0xfffffffffffffe48,_Var1);
  rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_10);
  poVar3 = (ostream *)std::ostream::operator<<(&stack0xfffffffffffffe48,rVar4 * local_18);
  poVar3 = std::operator<<(poVar3,' ');
  std::operator<<(poVar3,local_40);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffe48);
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

inline std::string pretty_duration(fp_seconds secs) {
            auto magnitude = get_magnitude(secs);
            auto units = units_for_magnitude(magnitude);
#ifdef NONIUS_MSVC
            if(units == "μs") units = "us";
#endif
            std::ostringstream ss;
            ss << std::setprecision(ss.precision());
            ss << (secs.count() * magnitude) << ' ' << units;
            return ss.str();
        }